

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscrete.cpp
# Opt level: O1

ActionHistoryTree * __thiscall
PlanningUnitMADPDiscrete::CreateActionHistoryTree(PlanningUnitMADPDiscrete *this,Index agentI)

{
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *this_00;
  vector<TreeNode<ActionHistory>*,std::allocator<TreeNode<ActionHistory>*>> *this_01;
  pointer *ppuVar1;
  pointer *this_02;
  uint uVar2;
  iterator iVar3;
  iterator __position;
  iterator iVar4;
  pointer pvVar5;
  ulong uVar6;
  PlanningUnitMADPDiscrete *pPVar7;
  long lVar8;
  ActionHistoryTree *pAVar9;
  int iVar10;
  Index IVar11;
  undefined4 extraout_var;
  ActionHistory *pAVar12;
  ostream *poVar13;
  long *plVar14;
  TreeNode<ActionHistory> *pTVar15;
  _Rb_tree_header *p_Var16;
  TreeNode<ActionHistory> *pTVar17;
  LIndex sucI;
  ActionHistoryTree *oht;
  ActionHistoryTree *next_oht;
  ActionHistoryTree *root;
  queue<TreeNode<ActionHistory>_*,_std::deque<TreeNode<ActionHistory>_*,_std::allocator<TreeNode<ActionHistory>_*>_>_>
  ohtQueue;
  uint local_cc;
  TreeNode<ActionHistory> *local_c8;
  int local_bc;
  PlanningUnitMADPDiscrete *local_b8;
  long local_b0;
  int local_a4;
  TreeNode<ActionHistory> *local_a0;
  TreeNode<ActionHistory> *local_98;
  ActionHistoryTree *local_90;
  _Deque_base<TreeNode<ActionHistory>_*,_std::allocator<TreeNode<ActionHistory>_*>_> local_88;
  ulong local_38;
  size_t o;
  
  uVar6 = (ulong)agentI;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  std::_Deque_base<TreeNode<ActionHistory>_*,_std::allocator<TreeNode<ActionHistory>_*>_>::
  _M_initialize_map(&local_88,0);
  local_a4 = (int)(this->super_PlanningUnit)._m_horizon;
  iVar10 = (*(this->super_PlanningUnit)._vptr_PlanningUnit[7])(this,uVar6);
  o = CONCAT44(extraout_var,iVar10);
  local_98 = (TreeNode<ActionHistory> *)0x0;
  pAVar12 = (ActionHistory *)operator_new(0x30);
  local_b8 = this;
  ActionHistory::ActionHistory(pAVar12,this,agentI);
  local_90 = (ActionHistoryTree *)operator_new(0x58);
  local_90->_vptr_TreeNode = (_func_int **)&PTR__TreeNode_005cd770;
  p_Var16 = &(local_90->_m_successor)._M_t._M_impl.super__Rb_tree_header;
  (local_90->_m_successor)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (local_90->_m_successor)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (local_90->_m_successor)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var16->_M_header;
  (local_90->_m_successor)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var16->_M_header;
  (local_90->_m_successor)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_90->_m_pred = (TreeNode<ActionHistory> *)0x0;
  local_90->_m_index = 0;
  local_90->_m_indexValid = false;
  local_90->_m_containedElem = pAVar12;
  if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      local_88._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::deque<TreeNode<ActionHistory>*,std::allocator<TreeNode<ActionHistory>*>>::
    _M_push_back_aux<TreeNode<ActionHistory>*const&>
              ((deque<TreeNode<ActionHistory>*,std::allocator<TreeNode<ActionHistory>*>> *)&local_88
               ,&local_90);
  }
  else {
    *local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = local_90;
    local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
         local_88._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
  }
  local_b0 = uVar6 * 3;
  this_00 = (local_b8->_m_firstAHIforT).
            super__Vector_base<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start + uVar6;
  local_c8 = (TreeNode<ActionHistory> *)0x0;
  iVar3._M_current =
       (this_00->super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  local_38 = uVar6;
  if (iVar3._M_current ==
      (this_00->super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>)._M_impl
      .super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::
    _M_realloc_insert<unsigned_long_long>(this_00,iVar3,(unsigned_long_long *)&local_c8);
  }
  else {
    *iVar3._M_current = 0;
    (this_00->super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar3._M_current + 1;
  }
  local_a4 = local_a4 + -1;
  local_cc = 0;
  pTVar17 = (TreeNode<ActionHistory> *)0x0;
  while (lVar8 = local_b0, pPVar7 = local_b8, iVar10 = (int)pTVar17,
        ((long)local_88._M_impl.super__Deque_impl_data._M_start._M_last -
         (long)local_88._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) +
        ((long)local_88._M_impl.super__Deque_impl_data._M_finish._M_cur -
         (long)local_88._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) +
        ((((ulong)((long)local_88._M_impl.super__Deque_impl_data._M_finish._M_node -
                  (long)local_88._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
        (ulong)(local_88._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0)) *
        0x40 != 0) {
    local_c8 = *local_88._M_impl.super__Deque_impl_data._M_start._M_cur;
    local_c8->_m_index = (LIndex)pTVar17;
    local_c8->_m_indexValid = true;
    this_01 = (vector<TreeNode<ActionHistory>*,std::allocator<TreeNode<ActionHistory>*>> *)
              (&(((local_b8->_m_actionHistoryTreeVectors).
                  super__Vector_base<std::vector<TreeNode<ActionHistory>_*,_std::allocator<TreeNode<ActionHistory>_*>_>,_std::allocator<std::vector<TreeNode<ActionHistory>_*,_std::allocator<TreeNode<ActionHistory>_*>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                super__Vector_base<TreeNode<ActionHistory>_*,_std::allocator<TreeNode<ActionHistory>_*>_>
                )._M_impl.super__Vector_impl_data._M_start + local_b0);
    __position._M_current = *(TreeNode<ActionHistory> ***)(this_01 + 8);
    local_bc = iVar10;
    if (__position._M_current == *(TreeNode<ActionHistory> ***)(this_01 + 0x10)) {
      std::vector<TreeNode<ActionHistory>*,std::allocator<TreeNode<ActionHistory>*>>::
      _M_realloc_insert<TreeNode<ActionHistory>*const&>(this_01,__position,&local_c8);
    }
    else {
      *__position._M_current = local_c8;
      *(long *)(this_01 + 8) = *(long *)(this_01 + 8) + 8;
    }
    uVar2 = (uint)(local_c8->_m_containedElem->super_IndividualHistory).super_History._m_length;
    if (local_cc != uVar2) {
      IVar11 = Globals::CastLIndexToIndex
                         ((&(((local_b8->_m_firstAHIforT).
                              super__Vector_base<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                            )._M_impl.super__Vector_impl_data._M_start)[local_b0][local_cc]);
      local_a0 = (TreeNode<ActionHistory> *)(ulong)(local_bc - IVar11);
      ppuVar1 = &(((local_b8->_m_nrActionHistoriesT).
                   super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_start + local_b0;
      iVar4._M_current = ppuVar1[1];
      if (iVar4._M_current == ppuVar1[2]) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)ppuVar1,iVar4,
                   (unsigned_long *)&local_a0);
      }
      else {
        *iVar4._M_current = (unsigned_long)local_a0;
        ppuVar1[1] = iVar4._M_current + 1;
      }
      local_cc = local_cc + 1;
      if (local_cc != uVar2) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"ERROR: CreateActionHistories:  ++ts != ",0x27);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"(Index) thisLength !!! ts (now) is: ",0x24);
        poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>(poVar13,"thisLength  =",0xd);
        plVar14 = (long *)std::ostream::operator<<((ostream *)poVar13,uVar2);
        std::ios::widen((char)*(undefined8 *)(*plVar14 + -0x18) + (char)plVar14);
        std::ostream::put((char)plVar14);
        std::ostream::flush();
      }
      this_02 = &(((local_b8->_m_firstAHIforT).
                   super__Vector_base<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->
                 super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>).
                 _M_impl.super__Vector_impl_data._M_start + local_b0;
      iVar3._M_current = this_02[1];
      local_a0 = pTVar17;
      if (iVar3._M_current == this_02[2]) {
        std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::
        _M_realloc_insert<unsigned_long_long>
                  ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)this_02,iVar3,
                   (unsigned_long_long *)&local_a0);
      }
      else {
        *iVar3._M_current = (unsigned_long_long)pTVar17;
        this_02[1] = iVar3._M_current + 1;
      }
    }
    iVar10 = local_bc;
    if ((int)uVar2 < local_a4 && o != 0) {
      sucI = 0;
      do {
        pAVar12 = (ActionHistory *)operator_new(0x30);
        ActionHistory::ActionHistory(pAVar12,(Index)sucI,local_c8->_m_containedElem);
        local_98 = (TreeNode<ActionHistory> *)operator_new(0x58);
        local_98->_vptr_TreeNode = (_func_int **)&PTR__TreeNode_005cd770;
        p_Var16 = &(local_98->_m_successor)._M_t._M_impl.super__Rb_tree_header;
        (local_98->_m_successor)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        (local_98->_m_successor)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)0x0;
        (local_98->_m_successor)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &p_Var16->_M_header;
        (local_98->_m_successor)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             &p_Var16->_M_header;
        (local_98->_m_successor)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_98->_m_pred = (TreeNode<ActionHistory> *)0x0;
        local_98->_m_index = 0;
        local_98->_m_indexValid = false;
        local_98->_m_containedElem = pAVar12;
        TreeNode<ActionHistory>::SetSuccessor(local_c8,sucI,local_98);
        if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_88._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
          std::deque<TreeNode<ActionHistory>*,std::allocator<TreeNode<ActionHistory>*>>::
          _M_push_back_aux<TreeNode<ActionHistory>*const&>
                    ((deque<TreeNode<ActionHistory>*,std::allocator<TreeNode<ActionHistory>*>> *)
                     &local_88,&local_98);
        }
        else {
          *local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = local_98;
          local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_88._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
        }
        sucI = (LIndex)((Index)sucI + 1);
      } while (sucI < o);
    }
    if (local_88._M_impl.super__Deque_impl_data._M_start._M_cur ==
        local_88._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
      operator_delete(local_88._M_impl.super__Deque_impl_data._M_start._M_first,0x200);
      local_88._M_impl.super__Deque_impl_data._M_start._M_cur =
           local_88._M_impl.super__Deque_impl_data._M_start._M_node[1];
      local_88._M_impl.super__Deque_impl_data._M_start._M_last =
           local_88._M_impl.super__Deque_impl_data._M_start._M_cur + 0x40;
      local_88._M_impl.super__Deque_impl_data._M_start._M_first =
           local_88._M_impl.super__Deque_impl_data._M_start._M_cur;
      local_88._M_impl.super__Deque_impl_data._M_start._M_node =
           local_88._M_impl.super__Deque_impl_data._M_start._M_node + 1;
    }
    else {
      local_88._M_impl.super__Deque_impl_data._M_start._M_cur =
           local_88._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
    }
    pTVar17 = (TreeNode<ActionHistory> *)(ulong)(iVar10 + 1);
  }
  IVar11 = Globals::CastLIndexToIndex
                     ((&(((local_b8->_m_firstAHIforT).
                          super__Vector_base<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>)
                        ._M_impl.super__Vector_impl_data._M_start)[local_b0][local_cc]);
  local_c8 = (TreeNode<ActionHistory> *)(ulong)(iVar10 - IVar11);
  ppuVar1 = &(((pPVar7->_m_nrActionHistoriesT).
               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start + lVar8;
  iVar4._M_current = ppuVar1[1];
  if (iVar4._M_current == ppuVar1[2]) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)ppuVar1,iVar4,
               (unsigned_long *)&local_c8);
  }
  else {
    *iVar4._M_current = (unsigned_long)local_c8;
    ppuVar1[1] = iVar4._M_current + 1;
  }
  pTVar15 = (TreeNode<ActionHistory> *)
            IndexTools::CalculateNumberOfSequences(o,(pPVar7->super_PlanningUnit)._m_horizon - 1);
  if ((pTVar15 != pTVar17) ||
     (pvVar5 = (pPVar7->_m_actionHistoryTreeVectors).
               super__Vector_base<std::vector<TreeNode<ActionHistory>_*,_std::allocator<TreeNode<ActionHistory>_*>_>,_std::allocator<std::vector<TreeNode<ActionHistory>_*,_std::allocator<TreeNode<ActionHistory>_*>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
     pTVar15 !=
     (TreeNode<ActionHistory> *)
     ((long)(&(pvVar5->
              super__Vector_base<TreeNode<ActionHistory>_*,_std::allocator<TreeNode<ActionHistory>_*>_>
              )._M_impl.super__Vector_impl_data._M_finish)[lVar8] -
      (long)(&(pvVar5->
              super__Vector_base<TreeNode<ActionHistory>_*,_std::allocator<TreeNode<ActionHistory>_*>_>
              )._M_impl.super__Vector_impl_data._M_start)[lVar8] >> 3))) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr," WARNING:ActionHistoryIndex=",0x1c);
    poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>(poVar13," nrActionHistories=",0x13);
    poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar13," _m_actionHistoryTreeVectors[agentI=",0x24);
    poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,"].size()=",9);
    poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
    std::ostream::put((char)poVar13);
    std::ostream::flush();
  }
  iVar4._M_current =
       (pPVar7->_m_nrActionHistories).
       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_c8 = pTVar17;
  if (iVar4._M_current ==
      (pPVar7->_m_nrActionHistories).
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
              (&pPVar7->_m_nrActionHistories,iVar4,(unsigned_long *)&local_c8);
  }
  else {
    *iVar4._M_current = (unsigned_long)pTVar17;
    (pPVar7->_m_nrActionHistories).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar4._M_current + 1;
  }
  pAVar9 = local_90;
  std::_Deque_base<TreeNode<ActionHistory>_*,_std::allocator<TreeNode<ActionHistory>_*>_>::
  ~_Deque_base(&local_88);
  return pAVar9;
}

Assistant:

ActionHistoryTree* PlanningUnitMADPDiscrete::CreateActionHistoryTree(Index agentI)
{
    //we want to number the Action Histories breadth-first, so we 
    //use a queue:
    queue<ActionHistoryTree*> ohtQueue;
    
    Index ActionHistoryIndex = 0;
    int maxLength = GetHorizon() - 1;//max. action hist length = h - 1
    size_t nrO = GetNrActions(agentI);
    ActionHistory* next_oh = 0;
    ActionHistoryTree* next_oht = 0;
    
    // return a new initial (=empty) action history

    //action history never has an initial action
    //if(!GetMADPDI()->IsInitialActionEmpty())
    //    throw E("this MADP issues a non-empty initial action, but this is not yet supported by PlanningUnitMADPDiscrete::CreateActionHistoryTree");

    ActionHistory* oh = new ActionHistory(*this, agentI);
    ActionHistoryTree* root = new ActionHistoryTree(oh);//, nrO);
    ohtQueue.push(root);
    Index ts = 0;
    _m_firstAHIforT[agentI].push_back(ActionHistoryIndex);
    while(ohtQueue.size() > 0)
    {
        ActionHistoryTree* oht = ohtQueue.front();
        oht->SetIndex(ActionHistoryIndex);
        _m_actionHistoryTreeVectors[agentI].push_back(oht);
        int thisLength = oht->GetContainedElement()->GetLength(); 
        if(ts != (Index) thisLength ) //length 0 <-> ts 0 
        {
            // we've now started processing AHs for the next ts
            Index nr_AHI_for_ts = ActionHistoryIndex - 
                CastLIndexToIndex(_m_firstAHIforT[agentI][ts]);
#if DEBUG_PUDCAHT
            cout << "First ah for next ts+1: store nr of ts-AH..."<<endl<<
                "_m_firstAHIforT[agentI="<<agentI<<"][ts="<<ts<<"] = "<<
                _m_firstAHIforT[agentI][ts] << ", current AHI = " <<
                ActionHistoryIndex << endl;
            Index tempIndex = _m_nrActionHistoriesT[agentI].size();
#endif                
            _m_nrActionHistoriesT[agentI].push_back(nr_AHI_for_ts); 
#if DEBUG_PUDCAHT
            cout << "Set  _m_nrActionHistoriesT[agentI="<<agentI<<"][t="<<
                tempIndex <<" (ts="<<ts<<")] = "<< nr_AHI_for_ts <<endl;
#endif
            if(++ts != (Index) thisLength)
                cerr << "ERROR: CreateActionHistories:  ++ts != "<<
                    "(Index) thisLength !!! ts (now) is: "<<ts<<
                    "thisLength  =" << thisLength <<endl;            
            _m_firstAHIforT[agentI].push_back(ActionHistoryIndex);            
        }
        
        ActionHistoryIndex++; //index of an Action HISTORY
        
        if(thisLength < maxLength)
            for(Index obsI = 0; obsI < nrO; obsI++) //obsI = action index
            {
                next_oh = new ActionHistory(obsI, 
                    oht->GetActionHistory());
                next_oht = new ActionHistoryTree(next_oh);//, nrO);
                oht->SetSuccessor(obsI, next_oht);
                ohtQueue.push(next_oht);
            }
        ohtQueue.pop();
    }    
    //there is no next time step, so _m_nrObservationHistoriesT[agentI][lastTs]
    //have not been stored yet: do this now
    Index nr_AHI_for_ts = ActionHistoryIndex
        - CastLIndexToIndex(_m_firstAHIforT[agentI][ts]);
#if DEBUG_PUDCAHT
    cout << "Last ts end: store nr of ts=h-1 AH..."<<endl<<
        "_m_firstAHIforT[agentI="<<agentI<<"][ts="<<ts<<"] = "<<
        _m_firstAHIforT[agentI][ts] << ", current AHI = " <<
        ActionHistoryIndex << endl;
    Index tempIndex = _m_nrActionHistoriesT[agentI].size();
#endif
    _m_nrActionHistoriesT[agentI].push_back(nr_AHI_for_ts);
#if DEBUG_PUDCAHT
    cout << "Set  _m_nrActionHistoriesT[agentI="<<agentI<<"][t="<<tempIndex
         <<" (last time step ts="<<ts<<")] = "<< nr_AHI_for_ts<<endl;
#endif

    //in a horizon h MADP without initial observation, the max. action
    //sequence length is h-1 actions (and the minimum is 0).
    //(after h actions the problem is ended already - length-h action sequences
    //are not considered.)
    size_t nrActionHist;
    size_t length = GetHorizon() - 1; // = maxLength 
    nrActionHist = IndexTools::CalculateNumberOfSequences(nrO, length);
    
    if( ActionHistoryIndex != nrActionHist || 
        nrActionHist != _m_actionHistoryTreeVectors[agentI].size() )
        cerr << " WARNING:ActionHistoryIndex="<< ActionHistoryIndex <<
        " nrActionHistories=" << nrActionHist << 
        " _m_actionHistoryTreeVectors[agentI="<<agentI<<"].size()="<<
        _m_actionHistoryTreeVectors[agentI].size() << endl;
    
    _m_nrActionHistories.push_back(ActionHistoryIndex);
    
    return(root);
}